

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_str_offsets.c
# Opt level: O0

int dwarf_str_offsets_value_by_index
              (Dwarf_Str_Offsets_Table sot,Dwarf_Unsigned index,Dwarf_Unsigned *stroffset,
              Dwarf_Error *error)

{
  Dwarf_Byte_Ptr readend;
  Dwarf_Unsigned _ltmp;
  Dwarf_Small *end_ptr;
  Dwarf_Debug dbg;
  Dwarf_Unsigned secsize;
  Dwarf_Unsigned entryoffset;
  Dwarf_Unsigned val;
  Dwarf_Small *entryptr;
  Dwarf_Error *error_local;
  Dwarf_Unsigned *stroffset_local;
  Dwarf_Unsigned index_local;
  Dwarf_Str_Offsets_Table sot_local;
  
  val = 0;
  entryoffset = 0;
  secsize = 0;
  dbg = (Dwarf_Debug)0x0;
  end_ptr = (Dwarf_Small *)0x0;
  _ltmp = 0;
  entryptr = (Dwarf_Small *)error;
  error_local = (Dwarf_Error *)stroffset;
  stroffset_local = (Dwarf_Unsigned *)index;
  index_local = (Dwarf_Unsigned)sot;
  if (sot == (Dwarf_Str_Offsets_Table)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x192);
    sot_local._4_4_ = 1;
  }
  else if (sot->so_dbg == (Dwarf_Debug)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x193);
    sot_local._4_4_ = 1;
  }
  else if (sot->so_magic_value == 0x2feed2) {
    end_ptr = (Dwarf_Small *)sot->so_dbg;
    dbg = (Dwarf_Debug)(((Dwarf_Debug)end_ptr)->de_debug_str_offsets).dss_size;
    if (index < sot->so_array_entry_count) {
      secsize = index * sot->so_array_entry_size +
                sot->so_table_start_offset + sot->so_lcl_offset_to_array;
      val = (Dwarf_Unsigned)(sot->so_section_start_ptr + secsize);
      if ((dbg < secsize) ||
         (dbg < (Dwarf_Debug)
                ((long)&((Dwarf_Debug)secsize)->de_magic + (ulong)sot->so_array_entry_size))) {
        _dwarf_error_string((Dwarf_Debug)end_ptr,error,0x197,
                            "DW_DLE_STR_OFFSETS_ARRAY_INDEX_WRONG: A libdwarf internal bug. Report to the maintainers"
                           );
        sot_local._4_4_ = 1;
      }
      else {
        _ltmp = val + (long)(int)(uint)sot->so_array_entry_size;
        readend = (Dwarf_Byte_Ptr)0x0;
        if ((Dwarf_Small *)(val + (long)(int)(uint)sot->so_array_entry_size) < val) {
          _dwarf_error_string((Dwarf_Debug)end_ptr,error,0x14b,
                              "DW_DLE_READ_LITTLEENDIAN_ERROR Read starts past the end of section");
          sot_local._4_4_ = 1;
        }
        else if (_ltmp < (Dwarf_Small *)(val + (long)(int)(uint)sot->so_array_entry_size)) {
          _dwarf_error_string((Dwarf_Debug)end_ptr,error,0x14b,
                              "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section"
                             );
          sot_local._4_4_ = 1;
        }
        else {
          (*((Dwarf_Debug)end_ptr)->de_copy_word)
                    (&readend,(void *)val,(unsigned_long)sot->so_array_entry_size);
          *error_local = (Dwarf_Error)readend;
          sot_local._4_4_ = 0;
        }
      }
    }
    else {
      sot_local._4_4_ = -1;
    }
  }
  else {
    _dwarf_error(sot->so_dbg,error,0x194);
    sot_local._4_4_ = 1;
  }
  return sot_local._4_4_;
}

Assistant:

int
dwarf_str_offsets_value_by_index(Dwarf_Str_Offsets_Table sot,
    Dwarf_Unsigned index,
    Dwarf_Unsigned *stroffset,
    Dwarf_Error *error)
{
    Dwarf_Small *entryptr = 0;
    Dwarf_Unsigned val = 0;
    Dwarf_Unsigned entryoffset = 0;
    Dwarf_Unsigned secsize = 0;
    Dwarf_Debug dbg = 0;
    Dwarf_Small *end_ptr = 0;
/* so_section_size */

    VALIDATE_SOT(sot)
    dbg = sot->so_dbg;
    secsize = dbg->de_debug_str_offsets.dss_size;
    if (index >= sot->so_array_entry_count) {
        return DW_DLV_NO_ENTRY;
    }
    entryoffset = sot->so_table_start_offset +
        sot->so_lcl_offset_to_array;
    entryoffset += index*sot->so_array_entry_size;
    entryptr = sot->so_section_start_ptr + entryoffset;
    if (entryoffset > secsize ||
        (entryoffset+sot->so_array_entry_size) > secsize) {
        _dwarf_error_string(dbg,error,
            DW_DLE_STR_OFFSETS_ARRAY_INDEX_WRONG,
            "DW_DLE_STR_OFFSETS_ARRAY_INDEX_WRONG: "
            "A libdwarf internal bug. Report to the maintainers");
        return DW_DLV_ERROR;
    }
    end_ptr = entryptr+sot->so_array_entry_size;
    READ_UNALIGNED_CK(dbg, val, Dwarf_Unsigned,
        entryptr, sot->so_array_entry_size,error,end_ptr);
    *stroffset = val;
    return DW_DLV_OK;
}